

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O3

C_Type * struct_decl(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  C_Type *pCVar5;
  int sz;
  int iVar6;
  int iVar7;
  C_Member *pCVar8;
  
  pCVar5 = struct_union_decl(parser,rest,tok);
  pCVar5->kind = TY_STRUCT;
  if (-1 < pCVar5->size) {
    pCVar8 = pCVar5->members;
    if (pCVar8 == (C_Member *)0x0) {
      iVar6 = -1;
    }
    else {
      _Var1 = pCVar5->is_packed;
      iVar6 = 0;
      do {
        if (pCVar8->is_bitfield == true) {
          iVar2 = pCVar8->bit_width;
          iVar3 = pCVar8->ty->size;
          iVar4 = iVar3 * 8;
          if (iVar2 == 0) {
            iVar6 = iVar6 + -1 + iVar4;
            iVar6 = iVar6 - iVar6 % iVar4;
          }
          else {
            if (iVar6 / iVar4 != (iVar6 + -1 + iVar2) / iVar4) {
              iVar6 = iVar6 + -1 + iVar4;
              iVar6 = iVar6 - iVar6 % iVar4;
            }
            iVar7 = iVar6 + 7;
            if (-1 < iVar6) {
              iVar7 = iVar6;
            }
            pCVar8->offset = (iVar7 >> 3) - (int)(CONCAT44(iVar7 >> 0x1f,iVar7 >> 3) % (long)iVar3);
            pCVar8->bit_offset = iVar6 % iVar4;
            iVar6 = iVar2 + iVar6;
          }
        }
        else {
          if (_Var1 == false) {
            iVar6 = iVar6 + -1 + pCVar8->align * 8;
            iVar6 = iVar6 - iVar6 % (pCVar8->align << 3);
          }
          iVar4 = iVar6 + 7;
          if (-1 < iVar6) {
            iVar4 = iVar6;
          }
          pCVar8->offset = iVar4 >> 3;
          iVar6 = iVar6 + pCVar8->ty->size * 8;
        }
        if ((_Var1 == false) && (pCVar5->align < pCVar8->align)) {
          pCVar5->align = pCVar8->align;
        }
        pCVar8 = pCVar8->next;
      } while (pCVar8 != (C_Member *)0x0);
      iVar6 = iVar6 + -1;
    }
    iVar6 = iVar6 + pCVar5->align * 8;
    iVar6 = iVar6 - iVar6 % (pCVar5->align << 3);
    iVar4 = iVar6 + 7;
    if (-1 < iVar6) {
      iVar4 = iVar6;
    }
    pCVar5->size = iVar4 >> 3;
  }
  return pCVar5;
}

Assistant:

static C_Type *struct_decl(C_Parser *parser, C_Token **rest, C_Token *tok) {
  C_Type *ty = struct_union_decl(parser, rest, tok);
  ty->kind = TY_STRUCT;

  if (ty->size < 0)
    return ty;

  // Assign offsets within the struct to members.
  int bits = 0;

  for (C_Member *mem = ty->members; mem; mem = mem->next) {
    if (mem->is_bitfield && mem->bit_width == 0) {
      // Zero-width anonymous bitfield has a special meaning.
      // It affects only alignment.
      bits = C_align_to(bits, mem->ty->size * 8);
    } else if (mem->is_bitfield) {
      int sz = mem->ty->size;
      if (bits / (sz * 8) != (bits + mem->bit_width - 1) / (sz * 8))
        bits = C_align_to(bits, sz * 8);

      mem->offset = align_down(bits / 8, sz);
      mem->bit_offset = bits % (sz * 8);
      bits += mem->bit_width;
    } else {
      if (!ty->is_packed)
        bits = C_align_to(bits, mem->align * 8);
      mem->offset = bits / 8;
      bits += mem->ty->size * 8;
    }

    if (!ty->is_packed && ty->align < mem->align)
      ty->align = mem->align;
  }

  ty->size = C_align_to(bits, ty->align * 8) / 8;
  return ty;
}